

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SpectrumDotsTexture::Evaluate
          (SpectrumDotsTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  anon_class_24_3_48d30edf func;
  bool bVar1;
  undefined1 auVar2 [64];
  SampledSpectrum SVar3;
  DispatchSplit<12> local_a9;
  undefined8 *local_a8;
  Tuple2<pbrt::Point2,_float> local_a0;
  Tuple3<pbrt::Point3,_float> *local_98;
  undefined8 **ppuStack_90;
  Tuple2<pbrt::Point2,_float> *pTStack_88;
  float afStack_80 [2];
  undefined8 local_78;
  undefined8 local_70;
  Tuple3<pbrt::Point3,_float> local_68 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_50 [4];
  undefined1 extraout_var [56];
  
  local_a8 = &local_70;
  local_a0 = (Tuple2<pbrt::Point2,_float>)&local_78;
  ppuStack_90 = &local_a8;
  pTStack_88 = &local_a0;
  local_70 = 0;
  local_78 = 0;
  local_98 = local_68;
  local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_50[1].z = ctx.dudx;
  aTStack_50[2].x = ctx.dudy;
  aTStack_50[2].y = ctx.dvdx;
  aTStack_50[2].z = ctx.dvdy;
  aTStack_50[3].x = (float)ctx.faceIndex;
  func.dstdx = (Vector2f **)ppuStack_90;
  func.ctx = (TextureEvalContext *)local_98;
  func.dstdy = (Vector2f **)pTStack_88;
  auVar2._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar2._8_56_ = extraout_var;
  local_a0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar2._0_16_);
  bVar1 = DotsBase::Inside((Point2f *)&local_a0);
  if (bVar1) {
    local_a8 = (undefined8 *)
               (this->insideDot).
               super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               .bits;
  }
  else {
    local_a8 = (undefined8 *)
               (this->outsideDot).
               super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               .bits;
  }
  aTStack_50[2].z = ctx.dvdy;
  aTStack_50[3].x = (float)ctx.faceIndex;
  aTStack_50[2].x = ctx.dudy;
  aTStack_50[2].y = ctx.dvdx;
  aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_50[1].z = ctx.dudx;
  aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  afStack_80[0] = lambda.pdf.values[2];
  afStack_80[1] = lambda.pdf.values[3];
  pTStack_88 = (Tuple2<pbrt::Point2,_float> *)lambda.pdf.values._0_8_;
  ppuStack_90 = (undefined8 **)lambda.lambda.values._8_8_;
  local_98 = (Tuple3<pbrt::Point3,_float> *)lambda.lambda.values._0_8_;
  SVar3 = detail::DispatchSplit<12>::operator()(&local_a9);
  return (array<float,_4>)(array<float,_4>)SVar3;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Inside(st) ? insideDot.Evaluate(ctx, lambda)
                          : outsideDot.Evaluate(ctx, lambda);
    }